

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O2

void __thiscall HPresolve::resizeImpliedBounds(HPresolve *this)

{
  vector<double,_std::allocator<double>_> *pvVar1;
  vector<double,_std::allocator<double>_> *pvVar2;
  vector<int,_std::allocator<int>_> *pvVar3;
  vector<double,_std::allocator<double>_> *pvVar4;
  vector<double,_std::allocator<double>_> *pvVar5;
  value_type vVar6;
  double dVar7;
  reference pvVar8;
  reference pvVar9;
  int i;
  size_type sVar10;
  int i_1;
  int iVar11;
  vector<double,_std::allocator<double>_> teup;
  vector<double,_std::allocator<double>_> temp;
  _Vector_base<double,_std::allocator<double>_> local_60;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  pvVar1 = &this->implRowDualLower;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_48,pvVar1);
  pvVar2 = &this->implRowDualUpper;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_60,pvVar2);
  std::vector<double,_std::allocator<double>_>::resize(pvVar1,(long)(this->super_HPreData).numRow);
  std::vector<double,_std::allocator<double>_>::resize(pvVar2,(long)(this->super_HPreData).numRow);
  pvVar3 = &(this->super_HPreData).flagRow;
  iVar11 = 0;
  for (sVar10 = 0; (long)sVar10 < (long)(this->super_HPreData).numRowOriginal; sVar10 = sVar10 + 1)
  {
    pvVar8 = std::vector<int,_std::allocator<int>_>::at(pvVar3,sVar10);
    if (*pvVar8 != 0) {
      pvVar9 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)&local_48,sVar10);
      vVar6 = *pvVar9;
      pvVar9 = std::vector<double,_std::allocator<double>_>::at(pvVar1,(long)iVar11);
      *pvVar9 = vVar6;
      pvVar9 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)&local_60,sVar10);
      vVar6 = *pvVar9;
      pvVar9 = std::vector<double,_std::allocator<double>_>::at(pvVar2,(long)iVar11);
      *pvVar9 = vVar6;
      iVar11 = iVar11 + 1;
    }
  }
  pvVar1 = &this->implRowValueLower;
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)&local_48,pvVar1);
  pvVar2 = &this->implRowValueUpper;
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)&local_60,pvVar2);
  std::vector<double,_std::allocator<double>_>::resize(pvVar1,(long)(this->super_HPreData).numRow);
  std::vector<double,_std::allocator<double>_>::resize(pvVar2,(long)(this->super_HPreData).numRow);
  pvVar5 = &(this->super_HPreData).rowLower;
  pvVar4 = &(this->super_HPreData).rowUpper;
  iVar11 = 0;
  for (sVar10 = 0; (long)sVar10 < (long)(this->super_HPreData).numRowOriginal; sVar10 = sVar10 + 1)
  {
    pvVar8 = std::vector<int,_std::allocator<int>_>::at(pvVar3,sVar10);
    if (*pvVar8 != 0) {
      pvVar9 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)&local_48,sVar10);
      dVar7 = *pvVar9;
      pvVar9 = std::vector<double,_std::allocator<double>_>::at(pvVar5,sVar10);
      if (dVar7 < *pvVar9) {
        pvVar9 = std::vector<double,_std::allocator<double>_>::at(pvVar5,sVar10);
        vVar6 = *pvVar9;
        pvVar9 = std::vector<double,_std::allocator<double>_>::at
                           ((vector<double,_std::allocator<double>_> *)&local_48,sVar10);
        *pvVar9 = vVar6;
      }
      pvVar9 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)&local_48,sVar10);
      vVar6 = *pvVar9;
      pvVar9 = std::vector<double,_std::allocator<double>_>::at(pvVar1,(long)iVar11);
      *pvVar9 = vVar6;
      pvVar9 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)&local_60,sVar10);
      dVar7 = *pvVar9;
      pvVar9 = std::vector<double,_std::allocator<double>_>::at(pvVar4,sVar10);
      if (*pvVar9 <= dVar7 && dVar7 != *pvVar9) {
        pvVar9 = std::vector<double,_std::allocator<double>_>::at(pvVar4,sVar10);
        vVar6 = *pvVar9;
        pvVar9 = std::vector<double,_std::allocator<double>_>::at
                           ((vector<double,_std::allocator<double>_> *)&local_60,sVar10);
        *pvVar9 = vVar6;
      }
      pvVar9 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)&local_60,sVar10);
      vVar6 = *pvVar9;
      pvVar9 = std::vector<double,_std::allocator<double>_>::at(pvVar2,(long)iVar11);
      *pvVar9 = vVar6;
      iVar11 = iVar11 + 1;
    }
  }
  pvVar1 = &this->implColDualLower;
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)&local_48,pvVar1);
  pvVar2 = &this->implColDualUpper;
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)&local_60,pvVar2);
  std::vector<double,_std::allocator<double>_>::resize(pvVar1,(long)(this->super_HPreData).numCol);
  std::vector<double,_std::allocator<double>_>::resize(pvVar2,(long)(this->super_HPreData).numCol);
  pvVar3 = &(this->super_HPreData).flagCol;
  iVar11 = 0;
  for (sVar10 = 0; (long)sVar10 < (long)(this->super_HPreData).numColOriginal; sVar10 = sVar10 + 1)
  {
    pvVar8 = std::vector<int,_std::allocator<int>_>::at(pvVar3,sVar10);
    if (*pvVar8 != 0) {
      pvVar9 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)&local_48,sVar10);
      vVar6 = *pvVar9;
      pvVar9 = std::vector<double,_std::allocator<double>_>::at(pvVar1,(long)iVar11);
      *pvVar9 = vVar6;
      pvVar9 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)&local_60,sVar10);
      vVar6 = *pvVar9;
      pvVar9 = std::vector<double,_std::allocator<double>_>::at(pvVar2,(long)iVar11);
      *pvVar9 = vVar6;
      iVar11 = iVar11 + 1;
    }
  }
  pvVar2 = &this->implColLower;
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)&local_48,pvVar2);
  pvVar5 = &this->implColUpper;
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)&local_60,pvVar5);
  std::vector<double,_std::allocator<double>_>::resize(pvVar2,(long)(this->super_HPreData).numCol);
  std::vector<double,_std::allocator<double>_>::resize(pvVar5,(long)(this->super_HPreData).numCol);
  pvVar1 = &(this->super_HPreData).colLower;
  pvVar4 = &(this->super_HPreData).colUpper;
  iVar11 = 0;
  for (sVar10 = 0; (long)sVar10 < (long)(this->super_HPreData).numColOriginal; sVar10 = sVar10 + 1)
  {
    pvVar8 = std::vector<int,_std::allocator<int>_>::at(pvVar3,sVar10);
    if (*pvVar8 != 0) {
      pvVar9 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)&local_48,sVar10);
      dVar7 = *pvVar9;
      pvVar9 = std::vector<double,_std::allocator<double>_>::at(pvVar1,sVar10);
      if (dVar7 < *pvVar9) {
        pvVar9 = std::vector<double,_std::allocator<double>_>::at(pvVar1,sVar10);
        vVar6 = *pvVar9;
        pvVar9 = std::vector<double,_std::allocator<double>_>::at
                           ((vector<double,_std::allocator<double>_> *)&local_48,sVar10);
        *pvVar9 = vVar6;
      }
      pvVar9 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)&local_48,sVar10);
      vVar6 = *pvVar9;
      pvVar9 = std::vector<double,_std::allocator<double>_>::at(pvVar2,(long)iVar11);
      *pvVar9 = vVar6;
      pvVar9 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)&local_60,sVar10);
      dVar7 = *pvVar9;
      pvVar9 = std::vector<double,_std::allocator<double>_>::at(pvVar4,sVar10);
      if (*pvVar9 <= dVar7 && dVar7 != *pvVar9) {
        pvVar9 = std::vector<double,_std::allocator<double>_>::at(pvVar4,sVar10);
        vVar6 = *pvVar9;
        pvVar9 = std::vector<double,_std::allocator<double>_>::at
                           ((vector<double,_std::allocator<double>_> *)&local_60,sVar10);
        *pvVar9 = vVar6;
      }
      pvVar9 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)&local_60,sVar10);
      vVar6 = *pvVar9;
      pvVar9 = std::vector<double,_std::allocator<double>_>::at(pvVar5,(long)iVar11);
      *pvVar9 = vVar6;
      iVar11 = iVar11 + 1;
    }
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_60);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void HPresolve::resizeImpliedBounds() {
    //implied bounds for crashes
	//row duals
    vector<double> temp = implRowDualLower;
    vector<double> teup = implRowDualUpper;
    implRowDualLower.resize(numRow);
    implRowDualUpper.resize(numRow);

    int k=0;
    for (int i=0;i<numRowOriginal;++i)
    	if (flagRow.at(i)) {
    		implRowDualLower.at(k) = temp.at(i);
    		implRowDualUpper.at(k) = teup.at(i);
    		k++;
	    }

    //row value
    temp = implRowValueLower;
    teup = implRowValueUpper;
    implRowValueLower.resize(numRow);
    implRowValueUpper.resize(numRow);
    k=0;
    for (int i=0;i<numRowOriginal;++i)
    	if (flagRow.at(i)) {
    		if (temp.at(i) < rowLower.at(i))
    			temp.at(i) = rowLower.at(i);
    		implRowValueLower.at(k) = temp.at(i);
    		if (teup.at(i) > rowUpper.at(i))
    			teup.at(i) = rowUpper.at(i);
    		implRowValueUpper.at(k) = teup.at(i);
    		k++;
	    }

    //column dual
    temp = implColDualLower;
    teup = implColDualUpper;
    implColDualLower.resize(numCol);
    implColDualUpper.resize(numCol);

    k=0;
    for (int i=0;i<numColOriginal;++i)
    	if (flagCol.at(i)) {
    		implColDualLower.at(k) = temp.at(i);
    		implColDualUpper.at(k) = teup.at(i);
    		k++;
	    }

    //column value
    temp = implColLower;
    teup = implColUpper;
    implColLower.resize(numCol);
    implColUpper.resize(numCol);

    k=0;
    for (int i=0;i<numColOriginal;++i)
    	if (flagCol.at(i)) {
    		if (temp.at(i) < colLower.at(i))
    			temp.at(i) = colLower.at(i);
    		implColLower.at(k) = temp.at(i);
    		if (teup.at(i) > colUpper.at(i))
    			teup.at(i) = colUpper.at(i);
    		implColUpper.at(k) = teup.at(i);
    		k++;
	    }
}